

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

RsProdItemSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::RsProdItemSyntax,slang::parsing::Token&,slang::syntax::ArgumentListSyntax*&>
          (BumpAllocator *this,Token *args,ArgumentListSyntax **args_1)

{
  ArgumentListSyntax *pAVar1;
  Info *pIVar2;
  TokenKind TVar3;
  undefined1 uVar4;
  NumericTokenFlags NVar5;
  uint32_t uVar6;
  RsProdItemSyntax *pRVar7;
  
  pRVar7 = (RsProdItemSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((RsProdItemSyntax *)this->endPtr < pRVar7 + 1) {
    pRVar7 = (RsProdItemSyntax *)allocateSlow(this,0x28,8);
  }
  else {
    this->head->current = (byte *)(pRVar7 + 1);
  }
  TVar3 = args->kind;
  uVar4 = args->field_0x2;
  NVar5.raw = (args->numFlags).raw;
  uVar6 = args->rawLen;
  pIVar2 = args->info;
  pAVar1 = *args_1;
  (pRVar7->super_RsProdSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (pRVar7->super_RsProdSyntax).super_SyntaxNode.kind = RsProdItem;
  (pRVar7->name).kind = TVar3;
  (pRVar7->name).field_0x2 = uVar4;
  (pRVar7->name).numFlags = (NumericTokenFlags)NVar5.raw;
  (pRVar7->name).rawLen = uVar6;
  (pRVar7->name).info = pIVar2;
  pRVar7->argList = pAVar1;
  if (pAVar1 != (ArgumentListSyntax *)0x0) {
    (pAVar1->super_SyntaxNode).parent = (SyntaxNode *)pRVar7;
  }
  return pRVar7;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }